

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_set_seg_dir(char *dir)

{
  int iVar1;
  char *pcVar2;
  char *tt;
  char *dir_local;
  
  requires_seg = 1;
  pcVar2 = strrchr(dir,0x2c);
  if (pcVar2 == (char *)0x0) {
    is_flat[2] = 0;
  }
  else {
    iVar1 = strcmp(pcVar2 + 1,"FLAT");
    if (iVar1 == 0) {
      is_flat[2] = 1;
      *pcVar2 = '\0';
    }
    else {
      iVar1 = strcmp(pcVar2 + 1,"CTL");
      if (iVar1 == 0) {
        is_flat[2] = 0;
        *pcVar2 = '\0';
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                ,0x2b9,"Assuming \',\' in seg dir is part of a pathname\n");
        is_flat[2] = 0;
      }
    }
  }
  data_dir[2] = dir;
  return 0;
}

Assistant:

int
corpus_set_seg_dir(const char *dir)
{
    char *tt;

    requires_seg = TRUE;

    tt = strrchr(dir, ',');
    if (tt != NULL) {
	if (strcmp(tt+1, "FLAT") == 0) {
	    is_flat[DATA_TYPE_SEG] = TRUE;
	    *tt = '\0';
	}
	else if (strcmp(tt+1, "CTL") == 0) {
	    is_flat[DATA_TYPE_SEG] = FALSE;
	    *tt = '\0';
	}
	else {
	    E_INFO("Assuming ',' in seg dir is part of a pathname\n");
	    
	    is_flat[DATA_TYPE_SEG] = FALSE;
	}
    }
    else {
	is_flat[DATA_TYPE_SEG] = FALSE;
    }

    data_dir[DATA_TYPE_SEG] = dir;

    return S3_SUCCESS;
}